

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::ConvertMesh
          (BlenderImporter *this,Scene *param_1,Object *param_2,Mesh *mesh,ConversionData *conv_data
          ,TempArray<std::vector,_aiMesh> *temp)

{
  _Rb_tree_node_base *__k;
  key_type_conflict *__k_00;
  pointer pMVar1;
  pointer pMVar2;
  pointer ppaVar3;
  _Base_ptr p_Var4;
  pointer psVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  mapped_type pMVar10;
  pointer pMVar11;
  pointer pTVar12;
  pointer pTVar13;
  pointer pMVar14;
  pointer pMVar15;
  pointer pMVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ConversionData *pCVar19;
  uint uVar20;
  mapped_type_conflict3 *pmVar21;
  aiMesh *paVar22;
  ulong uVar23;
  aiVector3D *paVar24;
  ulong uVar25;
  ulong *puVar26;
  aiFace *paVar27;
  pointer psVar28;
  difference_type dVar29;
  size_type sVar30;
  _Base_ptr p_Var31;
  uint *puVar32;
  void *pvVar33;
  ElemBase *pEVar34;
  iterator iVar35;
  mapped_type *ppMVar36;
  aiColor4D *paVar37;
  ulong uVar38;
  aiFace *paVar39;
  pointer ppaVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  int i_2;
  aiVector3D *paVar44;
  int i;
  int iVar45;
  long lVar46;
  int i_1;
  long lVar47;
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  *pdVar48;
  long local_5f8;
  allocator<char> local_5d9;
  ConversionData *local_5d8;
  long local_5d0;
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  *local_5c8;
  aiVector3D *local_5c0;
  MaterialTextureUVMappings matTexUvMappings;
  TextureUVMapping texuv;
  shared_ptr<Assimp::Blender::Material> pMat;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  mat_num_to_mesh_idx;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat_verts;
  _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
  local_4b8;
  _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
  local_498;
  _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
  local_478;
  _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
  local_458;
  iterator has;
  
  if ((((long)mesh->totface != 0) || (mesh->totloop != 0)) && (iVar45 = mesh->totvert, iVar45 != 0))
  {
    if ((ulong)(((long)(mesh->mface).
                       super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       .
                       super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(mesh->mface).
                      super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
                      super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <
        (ulong)(long)mesh->totface) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&has,"Number of faces is larger than the corresponding array",
                 (allocator<char> *)&per_mat);
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
      std::__cxx11::string::~string((string *)&has);
      iVar45 = mesh->totvert;
    }
    if ((ulong)(((long)(mesh->mvert).
                       super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       .
                       super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(mesh->mvert).
                      super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                      super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) < (ulong)(long)iVar45) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&has,"Number of vertices is larger than the corresponding array",
                 (allocator<char> *)&per_mat);
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
      std::__cxx11::string::~string((string *)&has);
    }
    lVar41 = 0x18;
    if ((ulong)(((long)(mesh->mloop).
                       super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       .
                       super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(mesh->mloop).
                      super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>.
                      super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <
        (ulong)(long)mesh->totloop) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&has,"Number of vertices is larger than the corresponding array",
                 (allocator<char> *)&per_mat);
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
      std::__cxx11::string::~string((string *)&has);
    }
    per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &per_mat._M_t._M_impl.super__Rb_tree_header._M_header;
    per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    per_mat._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header;
    per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar47 = 0x20;
    local_5d8 = conv_data;
    per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar46 = 0; lVar46 < mesh->totface; lVar46 = lVar46 + 1) {
      pMVar1 = (mesh->mface).
               super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
               super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __k_00 = (key_type_conflict *)((long)&(pMVar1->super_ElemBase)._vptr_ElemBase + lVar47);
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat,__k_00);
      *pmVar21 = *pmVar21 + 1;
      iVar45 = *(int *)((long)pMVar1 + lVar47 + -4);
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat_verts,__k_00);
      *pmVar21 = (*pmVar21 - (ulong)(iVar45 == 0)) + 4;
      lVar47 = lVar47 + 0x28;
    }
    for (lVar47 = 0; lVar47 < mesh->totpoly; lVar47 = lVar47 + 1) {
      pMVar2 = (mesh->mpoly).
               super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
               super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
               _M_impl.super__Vector_impl_data._M_start;
      has._M_cur = (_Elt_pointer)
                   CONCAT44(has._M_cur._4_4_,
                            (int)*(short *)((long)&(pMVar2->super_ElemBase)._vptr_ElemBase + lVar41)
                           );
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat,(key_type_conflict *)&has);
      *pmVar21 = *pmVar21 + 1;
      iVar45 = *(int *)((long)pMVar2 + lVar41 + -4);
      has._M_cur = (_Elt_pointer)
                   CONCAT44(has._M_cur._4_4_,
                            (int)*(short *)((long)&(pMVar2->super_ElemBase)._vptr_ElemBase + lVar41)
                           );
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat_verts,(key_type_conflict *)&has);
      *pmVar21 = *pmVar21 + (long)iVar45;
      lVar41 = lVar41 + 0x20;
    }
    lVar41 = (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&temp->arr,(lVar41 >> 3) + per_mat._M_t._M_impl.super__Rb_tree_header._M_node_count);
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header;
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_5c0 = (aiVector3D *)((mesh->id).name + 2);
    local_5c8 = &local_5d8->materials_raw;
    local_5d0 = lVar41;
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var31 = per_mat._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var31 != &per_mat._M_t._M_impl.super__Rb_tree_header;
        p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31)) {
      ppaVar40 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar3 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      has._M_cur = (_Elt_pointer)(long)(int)p_Var31[1]._M_color;
      pmVar21 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
      *pmVar21 = (long)ppaVar3 - (long)ppaVar40 >> 3;
      paVar22 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar22);
      has._M_cur = (_Elt_pointer)paVar22;
      std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                ((vector<aiMesh*,std::allocator<aiMesh*>> *)temp,(aiMesh **)&has);
      __k = p_Var31 + 1;
      paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat_verts,(key_type_conflict *)__k);
      uVar38 = *pmVar21;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar38;
      uVar23 = SUB168(auVar17 * ZEXT816(0xc),0);
      uVar25 = uVar23;
      if (SUB168(auVar17 * ZEXT816(0xc),8) != 0) {
        uVar25 = 0xffffffffffffffff;
      }
      paVar24 = (aiVector3D *)operator_new__(uVar25);
      if (uVar38 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar24,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar22->mVertices = paVar24;
      pmVar21 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&per_mat_verts,(key_type_conflict *)__k);
      uVar38 = *pmVar21;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar38;
      uVar25 = SUB168(auVar18 * ZEXT816(0xc),0);
      if (SUB168(auVar18 * ZEXT816(0xc),8) != 0) {
        uVar25 = 0xffffffffffffffff;
      }
      paVar24 = (aiVector3D *)operator_new__(uVar25);
      if (uVar38 != 0) {
        uVar38 = uVar38 * 0xc - 0xc;
        memset(paVar24,0,(uVar38 - uVar38 % 0xc) + 0xc);
      }
      paVar22->mNormals = paVar24;
      p_Var4 = p_Var31[1]._M_parent;
      puVar26 = (ulong *)operator_new__(-(ulong)((ulong)p_Var4 >> 0x3c != 0) | (long)p_Var4 * 0x10 |
                                        8);
      *puVar26 = (ulong)p_Var4;
      paVar27 = (aiFace *)(puVar26 + 1);
      if (p_Var4 != (_Base_ptr)0x0) {
        paVar39 = paVar27;
        do {
          paVar39->mNumIndices = 0;
          paVar39->mIndices = (uint *)0x0;
          paVar39 = paVar39 + 1;
        } while (paVar39 != paVar27 + (long)p_Var4);
      }
      paVar22->mFaces = paVar27;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&matTexUvMappings,(char *)local_5c0,(allocator<char> *)&texuv);
      pCVar19 = local_5d8;
      uVar38 = (ulong)matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      if ((matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xfffffc00) !=
          _S_red) {
        uVar38 = 0x3ff;
      }
      has._M_cur = (_Elt_pointer)CONCAT44(has._M_cur._4_4_,(ai_uint32)uVar38);
      pvVar33 = (void *)((long)&has._M_cur + 4);
      memcpy(pvVar33,(void *)matTexUvMappings._M_t._M_impl._0_8_,uVar38);
      *(undefined1 *)((long)&has._M_cur + uVar38 + 4) = 0;
      (paVar22->mName).length = (ai_uint32)uVar38;
      memcpy((paVar22->mName).data,pvVar33,uVar38);
      (paVar22->mName).data[uVar38] = '\0';
      std::__cxx11::string::~string((string *)&matTexUvMappings);
      psVar28 = (mesh->mat).
                super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                .
                super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = (mesh->mat).
               super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               .
               super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar28 == psVar5) {
        paVar22->mMaterialIndex = 0xffffffff;
      }
      else {
        uVar38 = (ulong)(int)__k->_M_color;
        if ((ulong)((long)psVar5 - (long)psVar28 >> 4) <= uVar38) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&has,"Material index is out of range",
                     (allocator<char> *)&matTexUvMappings);
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
          std::__cxx11::string::~string((string *)&has);
          uVar38 = (ulong)(int)__k->_M_color;
          psVar28 = (mesh->mat).
                    super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    .
                    super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *)
                   &matTexUvMappings,
                   &psVar28[uVar38].
                    super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>);
        local_458._M_cur =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_458._M_first =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_458._M_last =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_458._M_node =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_478._M_cur =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_478._M_first =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_478._M_last =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
        local_478._M_node =
             (pCVar19->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::
        find<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>,std::shared_ptr<Assimp::Blender::Material>>
                  (&has,&local_458,&local_478,
                   (shared_ptr<Assimp::Blender::Material> *)&matTexUvMappings);
        pdVar48 = local_5c8;
        if (has._M_cur ==
            (pCVar19->materials_raw).
            super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          sVar30 = std::
                   deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   ::size(local_5c8);
          paVar22->mMaterialIndex = (uint)sVar30;
          std::
          deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
          ::push_back(pdVar48,(value_type *)&matTexUvMappings);
        }
        else {
          local_498._M_cur =
               (pCVar19->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_498._M_first =
               (pCVar19->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
          local_498._M_last =
               (pCVar19->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_498._M_node =
               (pCVar19->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
          local_4b8._M_cur = has._M_cur;
          local_4b8._M_first = has._M_first;
          local_4b8._M_last = has._M_last;
          local_4b8._M_node = has._M_node;
          dVar29 = std::
                   distance<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>>
                             (&local_498,&local_4b8);
          paVar22->mMaterialIndex = (uint)dVar29;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &matTexUvMappings._M_t._M_impl.super__Rb_tree_header);
      }
    }
    lVar41 = 0x20;
    for (lVar47 = 0; lVar47 < mesh->totface; lVar47 = lVar47 + 1) {
      pMVar1 = (mesh->mface).
               super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
               super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
               _M_impl.super__Vector_impl_data._M_start;
      has._M_cur = (_Elt_pointer)
                   (long)*(int *)((long)&(pMVar1->super_ElemBase)._vptr_ElemBase + lVar41);
      pmVar21 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
      paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start[*pmVar21];
      paVar27 = paVar22->mFaces;
      uVar20 = paVar22->mNumFaces;
      paVar22->mNumFaces = uVar20 + 1;
      uVar43 = 4 - (*(int *)((long)pMVar1 + lVar41 + -4) == 0);
      paVar27[uVar20].mNumIndices = uVar43;
      puVar32 = (uint *)operator_new__((ulong)(uVar43 * 4));
      paVar27[uVar20].mIndices = puVar32;
      paVar24 = paVar22->mVertices + paVar22->mNumVertices;
      paVar44 = paVar22->mNormals + paVar22->mNumVertices;
      iVar45 = *(int *)((long)pMVar1 + lVar41 + -0x10);
      if (mesh->totvert <= iVar45) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,"Vertex index v1 out of range",
                   (allocator<char> *)&matTexUvMappings);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
        iVar45 = *(int *)((long)pMVar1 + lVar41 + -0x10);
      }
      pMVar6 = (mesh->mvert).
               super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar24->x = pMVar6[iVar45].co[0];
      paVar24->y = pMVar6[iVar45].co[1];
      paVar24->z = pMVar6[iVar45].co[2];
      paVar44->x = pMVar6[iVar45].no[0];
      paVar44->y = pMVar6[iVar45].no[1];
      paVar44->z = pMVar6[iVar45].no[2];
      uVar43 = paVar22->mNumVertices;
      paVar22->mNumVertices = uVar43 + 1;
      *paVar27[uVar20].mIndices = uVar43;
      iVar45 = *(int *)((long)pMVar1 + lVar41 + -0xc);
      if (mesh->totvert <= iVar45) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,"Vertex index v2 out of range",
                   (allocator<char> *)&matTexUvMappings);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
        iVar45 = *(int *)((long)pMVar1 + lVar41 + -0xc);
      }
      pMVar6 = (mesh->mvert).
               super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar24[1].x = pMVar6[iVar45].co[0];
      paVar24[1].y = pMVar6[iVar45].co[1];
      paVar24[1].z = pMVar6[iVar45].co[2];
      paVar44[1].x = pMVar6[iVar45].no[0];
      paVar44[1].y = pMVar6[iVar45].no[1];
      paVar44[1].z = pMVar6[iVar45].no[2];
      uVar43 = paVar22->mNumVertices;
      paVar22->mNumVertices = uVar43 + 1;
      paVar27[uVar20].mIndices[1] = uVar43;
      iVar45 = *(int *)((long)pMVar1 + lVar41 + -8);
      if (mesh->totvert <= iVar45) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,"Vertex index v3 out of range",
                   (allocator<char> *)&matTexUvMappings);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
        iVar45 = *(int *)((long)pMVar1 + lVar41 + -8);
      }
      pMVar6 = (mesh->mvert).
               super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar24[2].x = pMVar6[iVar45].co[0];
      paVar24[2].y = pMVar6[iVar45].co[1];
      paVar24[2].z = pMVar6[iVar45].co[2];
      paVar44[2].x = pMVar6[iVar45].no[0];
      paVar44[2].y = pMVar6[iVar45].no[1];
      paVar44[2].z = pMVar6[iVar45].no[2];
      uVar43 = paVar22->mNumVertices;
      paVar22->mNumVertices = uVar43 + 1;
      paVar27[uVar20].mIndices[2] = uVar43;
      iVar45 = *(int *)((long)pMVar1 + lVar41 + -4);
      if (mesh->totvert <= iVar45) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,"Vertex index v4 out of range",
                   (allocator<char> *)&matTexUvMappings);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
        iVar45 = *(int *)((long)pMVar1 + lVar41 + -4);
      }
      uVar43 = 4;
      if (iVar45 != 0) {
        pMVar6 = (mesh->mvert).
                 super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                 super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        paVar24[3].x = pMVar6[iVar45].co[0];
        paVar24[3].y = pMVar6[iVar45].co[1];
        paVar24[3].z = pMVar6[iVar45].co[2];
        paVar44[3].x = pMVar6[iVar45].no[0];
        paVar44[3].y = pMVar6[iVar45].no[1];
        paVar44[3].z = pMVar6[iVar45].no[2];
        uVar43 = paVar22->mNumVertices;
        paVar22->mNumVertices = uVar43 + 1;
        paVar27[uVar20].mIndices[3] = uVar43;
        uVar43 = 8;
      }
      paVar22->mPrimitiveTypes = paVar22->mPrimitiveTypes | uVar43;
      lVar41 = lVar41 + 0x28;
    }
    pdVar48 = (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               *)0x0;
    while ((long)pdVar48 < (long)mesh->totpoly) {
      pMVar2 = (mesh->mpoly).
               super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
               super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
               _M_impl.super__Vector_impl_data._M_start;
      has._M_cur = (_Elt_pointer)(long)pMVar2[(long)pdVar48].mat_nr;
      pmVar21 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
      paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start[*pmVar21];
      paVar27 = paVar22->mFaces;
      uVar20 = paVar22->mNumFaces;
      paVar22->mNumFaces = uVar20 + 1;
      uVar43 = pMVar2[(long)pdVar48].totloop;
      paVar27[uVar20].mNumIndices = uVar43;
      local_5c8 = pdVar48;
      pvVar33 = operator_new__((ulong)uVar43 << 2);
      local_5d8 = (ConversionData *)(paVar27 + uVar20);
      *(void **)&(local_5d8->objects)._M_t._M_impl.super__Rb_tree_header._M_header = pvVar33;
      local_5c0 = paVar22->mVertices;
      paVar24 = paVar22->mNormals;
      lVar41 = (ulong)paVar22->mNumVertices * 0xc;
      for (lVar47 = 0; lVar47 < pMVar2[(long)pdVar48].totloop; lVar47 = lVar47 + 1) {
        lVar46 = pMVar2[(long)pdVar48].loopstart + lVar47;
        pMVar7 = (mesh->mloop).
                 super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>.
                 super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar45 = pMVar7[lVar46].v;
        if (mesh->totvert <= iVar45) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&has,"Vertex index out of range",(allocator<char> *)&matTexUvMappings
                    );
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
          std::__cxx11::string::~string((string *)&has);
          iVar45 = pMVar7[lVar46].v;
        }
        pMVar6 = (mesh->mvert).
                 super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                 super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)&local_5c0->x + lVar41) = pMVar6[iVar45].co[0];
        *(float *)((long)&local_5c0->y + lVar41) = pMVar6[iVar45].co[1];
        *(float *)((long)&local_5c0->z + lVar41) = pMVar6[iVar45].co[2];
        *(float *)((long)&paVar24->x + lVar41) = pMVar6[iVar45].no[0];
        *(float *)((long)&paVar24->y + lVar41) = pMVar6[iVar45].no[1];
        *(float *)((long)&paVar24->z + lVar41) = pMVar6[iVar45].no[2];
        uVar20 = paVar22->mNumVertices;
        paVar22->mNumVertices = uVar20 + 1;
        *(uint *)(*(long *)&(local_5d8->objects)._M_t._M_impl.super__Rb_tree_header._M_header +
                 lVar47 * 4) = uVar20;
        lVar41 = lVar41 + 0xc;
      }
      paVar22->mPrimitiveTypes =
           paVar22->mPrimitiveTypes | (uint)(pMVar2[(long)pdVar48].totloop != 3) * 4 + 4;
      pdVar48 = (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 *)((long)&(local_5c8->
                           super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           )._M_impl.super__Deque_impl_data._M_map + 1);
    }
    matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header;
    matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    psVar28 = (mesh->mat).
              super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
              .
              super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (mesh->mat).
             super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             .
             super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar38 = 0; uVar38 != ((ulong)((long)psVar28 - (long)psVar5) >> 4 & 0xffffffff);
        uVar38 = uVar38 + 1) {
      std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>,
                 &(mesh->mat).
                  super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  .
                  super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar38].
                  super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>);
      texuv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      texuv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      texuv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &texuv._M_t._M_impl.super__Rb_tree_header._M_header;
      texuv._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar45 = 0;
      texuv._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           texuv._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar41 = 0; lVar41 != 0x120; lVar41 = lVar41 + 0x10) {
        lVar47 = *(long *)((long)&(pMat.
                                   super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->mtex[0].
                                  super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar41);
        if ((lVar47 != 0) && (*(char *)(lVar47 + 0x38) != '\0')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&has,(char *)(lVar47 + 0x38),&local_5d9);
          pEVar34 = Blender::getCustomDataLayerData(&mesh->ldata,CD_MLOOPUV,(string *)&has);
          std::__cxx11::string::~string((string *)&has);
          if (pEVar34 != (ElemBase *)0x0) {
            has._M_first = (_Elt_pointer)
                           __dynamic_cast(pEVar34,&Blender::ElemBase::typeinfo,
                                          &Blender::MLoopUV::typeinfo,0);
            has._M_cur = (_Elt_pointer)CONCAT44(has._M_cur._4_4_,iVar45);
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
            ::_M_emplace_unique<std::pair<unsigned_int,Assimp::Blender::MLoopUV_const*>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
                        *)&texuv,(pair<unsigned_int,_const_Assimp::Blender::MLoopUV_*> *)&has);
          }
        }
        iVar45 = iVar45 + 1;
      }
      if (texuv._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        has._M_cur = (_Elt_pointer)CONCAT44(has._M_cur._4_4_,(int)uVar38);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
        ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                    *)&has._M_first,&texuv._M_t);
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
        ::
        _M_emplace_unique<std::pair<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
                    *)&matTexUvMappings,
                   (pair<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>
                    *)&has);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                     *)&has._M_first);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
      ::~_Rb_tree(&texuv._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    pMVar8 = (mesh->mtface).
             super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
             super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar9 = (mesh->mtface).
             super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
             super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar8 != pMVar9) ||
       ((mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)(((long)pMVar9 - (long)pMVar8) / 0x38) < mesh->totface) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,
                   "Number of UV faces is larger than the corresponding UV face array (#1)",
                   (allocator<char> *)&texuv);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
      }
      local_5f8 = 0x14;
      for (ppaVar40 = (pointer)((long)(temp->arr).
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + local_5d0);
          ppaVar40 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppaVar40 = ppaVar40 + 1) {
        paVar22 = *ppaVar40;
        if ((paVar22->mNumVertices == 0) || (paVar22->mNumFaces == 0)) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x423,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        iVar35 = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                 ::find(&matTexUvMappings._M_t,&paVar22->mMaterialIndex);
        if ((_Rb_tree_header *)iVar35._M_node ==
            &matTexUvMappings._M_t._M_impl.super__Rb_tree_header) {
          uVar20 = (*ppaVar40)->mNumVertices;
          uVar38 = (ulong)uVar20 * 0xc;
          paVar24 = (aiVector3D *)operator_new__(uVar38);
          if (uVar20 != 0) {
            uVar38 = uVar38 - 0xc;
            memset(paVar24,0,(uVar38 - uVar38 % 0xc) + 0xc);
          }
          (*ppaVar40)->mTextureCoords[0] = paVar24;
        }
        else {
          for (uVar20 = 0; (_Base_ptr)(ulong)uVar20 < iVar35._M_node[2]._M_left; uVar20 = uVar20 + 1
              ) {
            uVar43 = (*ppaVar40)->mNumVertices;
            uVar38 = (ulong)uVar43 * 0xc;
            paVar24 = (aiVector3D *)operator_new__(uVar38);
            if (uVar43 != 0) {
              uVar38 = uVar38 - 0xc;
              memset(paVar24,0,(uVar38 - uVar38 % 0xc) + 0xc);
            }
            (*ppaVar40)->mTextureCoords[(long)(ulong)uVar20] = paVar24;
          }
        }
        (*ppaVar40)->mNumVertices = 0;
        (*ppaVar40)->mNumFaces = 0;
      }
      for (lVar41 = 0; lVar41 < mesh->totface; lVar41 = lVar41 + 1) {
        pMVar8 = (mesh->mtface).
                 super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
                 super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        has._M_cur = (_Elt_pointer)
                     (long)(mesh->mface).
                           super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           .
                           super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar41].mat_nr;
        pmVar21 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
        paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar21];
        uVar20 = paVar22->mNumFaces;
        paVar22->mNumFaces = uVar20 + 1;
        paVar27 = paVar22->mFaces;
        paVar24 = paVar22->mTextureCoords[0] + paVar22->mNumVertices;
        for (uVar38 = 0; uVar38 < paVar27[uVar20].mNumIndices; uVar38 = uVar38 + 1) {
          paVar24->x = *(float *)((long)(pMVar8->uv + uVar38 + 0xfffffffffffffffd) + 4U + local_5f8)
          ;
          paVar24->y = *(float *)((long)(pMVar8->uv + uVar38 + 0xfffffffffffffffe) + local_5f8);
          paVar24 = paVar24 + 1;
          paVar22->mNumVertices = paVar22->mNumVertices + 1;
        }
        local_5f8 = local_5f8 + 0x38;
      }
      for (lVar41 = 0; lVar41 < mesh->totpoly; lVar41 = lVar41 + 1) {
        pMVar2 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        has._M_cur = (_Elt_pointer)(long)pMVar2[lVar41].mat_nr;
        pmVar21 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
        paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar21];
        uVar20 = paVar22->mNumFaces;
        paVar22->mNumFaces = uVar20 + 1;
        paVar27 = paVar22->mFaces;
        has._M_cur = (_Elt_pointer)CONCAT44(has._M_cur._4_4_,(int)pMVar2[lVar41].mat_nr);
        iVar35 = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                 ::find(&matTexUvMappings._M_t,(key_type *)&has);
        if ((_Rb_tree_header *)iVar35._M_node ==
            &matTexUvMappings._M_t._M_impl.super__Rb_tree_header) {
          paVar24 = paVar22->mTextureCoords[0] + paVar22->mNumVertices;
          for (uVar43 = 0; uVar43 < paVar27[uVar20].mNumIndices; uVar43 = uVar43 + 1) {
            uVar42 = pMVar2[lVar41].loopstart + uVar43;
            pMVar11 = (mesh->mloopuv).
                      super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                      .
                      super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            paVar24->x = pMVar11[uVar42].uv[0];
            paVar24->y = pMVar11[uVar42].uv[1];
            paVar24 = paVar24 + 1;
            paVar22->mNumVertices = paVar22->mNumVertices + 1;
          }
        }
        else {
          uVar43 = 0;
          while( true ) {
            has._M_cur = (_Elt_pointer)CONCAT44(has._M_cur._4_4_,uVar43);
            if (iVar35._M_node[2]._M_left <= (_Base_ptr)(ulong)uVar43) break;
            ppMVar36 = std::
                       map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                       ::operator[]((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                                     *)&iVar35._M_node[1]._M_parent,(key_type *)&has);
            pMVar10 = *ppMVar36;
            lVar47 = (long)paVar22->mTextureCoords[(ulong)has._M_cur & 0xffffffff] +
                     (ulong)paVar22->mNumVertices * 0xc;
            for (uVar43 = 0; uVar43 < paVar27[uVar20].mNumIndices; uVar43 = uVar43 + 1) {
              uVar42 = pMVar2[lVar41].loopstart + uVar43;
              *(float *)lVar47 = pMVar10[uVar42].uv[0];
              *(float *)(lVar47 + 4) = pMVar10[uVar42].uv[1];
              lVar47 = lVar47 + 0xc;
            }
            if ((undefined1 *)((long)&iVar35._M_node[2]._M_left[-1]._M_right + 7) ==
                (undefined1 *)((ulong)has._M_cur & 0xffffffff)) {
              paVar22->mNumVertices = paVar22->mNumVertices + uVar43;
            }
            uVar43 = (int)has._M_cur + 1;
          }
        }
      }
    }
    lVar41 = local_5d0;
    pTVar12 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar13 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar12 != pTVar13) {
      if ((int)(((long)pTVar13 - (long)pTVar12) / 0x48) < mesh->totface) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,
                   "Number of faces is larger than the corresponding UV face array (#2)",
                   (allocator<char> *)&texuv);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
      }
      for (ppaVar40 = (pointer)((long)(temp->arr).
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar41);
          ppaVar40 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppaVar40 = ppaVar40 + 1) {
        uVar38 = (ulong)(*ppaVar40)->mNumVertices;
        if ((uVar38 == 0) || ((*ppaVar40)->mNumFaces == 0)) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x469,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        uVar38 = uVar38 * 0xc;
        paVar24 = (aiVector3D *)operator_new__(uVar38);
        uVar38 = uVar38 - 0xc;
        memset(paVar24,0,(uVar38 - uVar38 % 0xc) + 0xc);
        (*ppaVar40)->mTextureCoords[0] = paVar24;
        (*ppaVar40)->mNumVertices = 0;
        (*ppaVar40)->mNumFaces = 0;
      }
      lVar41 = 0x14;
      for (lVar47 = 0; lVar47 < mesh->totface; lVar47 = lVar47 + 1) {
        pTVar12 = (mesh->tface).
                  super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
                  super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        has._M_cur = (_Elt_pointer)
                     (long)(mesh->mface).
                           super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           .
                           super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar47].mat_nr;
        pmVar21 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
        paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar21];
        uVar20 = paVar22->mNumFaces;
        paVar22->mNumFaces = uVar20 + 1;
        paVar27 = paVar22->mFaces;
        paVar24 = paVar22->mTextureCoords[0] + paVar22->mNumVertices;
        for (uVar38 = 0; uVar38 < paVar27[uVar20].mNumIndices; uVar38 = uVar38 + 1) {
          paVar24->x = *(float *)((long)(pTVar12->uv + uVar38 + 0xfffffffffffffffd) + 4U + lVar41);
          paVar24->y = *(float *)((long)(pTVar12->uv + uVar38 + 0xfffffffffffffffe) + lVar41);
          paVar24 = paVar24 + 1;
          paVar22->mNumVertices = paVar22->mNumVertices + 1;
        }
        lVar41 = lVar41 + 0x48;
      }
    }
    lVar41 = local_5d0;
    pMVar14 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar15 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar14 != pMVar15) ||
       ((mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)((ulong)(((long)pMVar15 - (long)pMVar14) / 0x18) >> 2) < mesh->totface) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&has,
                   "Number of faces is larger than the corresponding color face array",
                   (allocator<char> *)&texuv);
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&has);
        std::__cxx11::string::~string((string *)&has);
      }
      for (ppaVar40 = (pointer)(lVar41 + (long)(temp->arr).
                                               super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
          ppaVar40 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppaVar40 = ppaVar40 + 1) {
        paVar22 = *ppaVar40;
        if (((ulong)paVar22->mNumVertices == 0) || (paVar22->mNumFaces == 0)) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x483,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        uVar38 = (ulong)paVar22->mNumVertices << 4;
        paVar37 = (aiColor4D *)operator_new__(uVar38);
        memset(paVar37,0,uVar38);
        paVar22->mColors[0] = paVar37;
        (*ppaVar40)->mNumVertices = 0;
        (*ppaVar40)->mNumFaces = 0;
      }
      iVar45 = 0;
      for (lVar41 = 0; lVar41 < mesh->totface; lVar41 = lVar41 + 1) {
        has._M_cur = (_Elt_pointer)
                     (long)(mesh->mface).
                           super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           .
                           super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar41].mat_nr;
        pmVar21 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
        paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar21];
        uVar20 = paVar22->mNumFaces;
        paVar22->mNumFaces = uVar20 + 1;
        paVar27 = paVar22->mFaces;
        paVar37 = paVar22->mColors[0] + paVar22->mNumVertices;
        for (uVar38 = 0; uVar38 < paVar27[uVar20].mNumIndices; uVar38 = uVar38 + 1) {
          uVar43 = iVar45 + (int)uVar38;
          pMVar14 = (mesh->mcol).
                    super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
                    super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar37->r = (float)(int)pMVar14[uVar43].r;
          paVar37->g = (float)(int)pMVar14[uVar43].g;
          paVar37->b = (float)(int)pMVar14[uVar43].b;
          paVar37->a = (float)(int)pMVar14[uVar43].a;
          paVar37 = paVar37 + 1;
          paVar22->mNumVertices = paVar22->mNumVertices + 1;
        }
        iVar45 = iVar45 + 4;
      }
      for (lVar41 = 0; lVar41 < mesh->totpoly; lVar41 = lVar41 + 1) {
        pMVar2 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        has._M_cur = (_Elt_pointer)(long)pMVar2[lVar41].mat_nr;
        pmVar21 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[](&mat_num_to_mesh_idx,(key_type_conflict1 *)&has);
        paVar22 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar21];
        uVar20 = paVar22->mNumFaces;
        paVar22->mNumFaces = uVar20 + 1;
        paVar27 = paVar22->mFaces;
        paVar37 = paVar22->mColors[0] + paVar22->mNumVertices;
        for (uVar43 = 0; uVar43 < paVar27[uVar20].mNumIndices; uVar43 = uVar43 + 1) {
          uVar42 = pMVar2[lVar41].loopstart + uVar43;
          pMVar16 = (mesh->mloopcol).
                    super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                    .
                    super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar37->r = (float)pMVar16[uVar42].r * 0.003921569;
          paVar37->g = (float)pMVar16[uVar42].g * 0.003921569;
          paVar37->b = (float)pMVar16[uVar42].b * 0.003921569;
          paVar37->a = (float)pMVar16[uVar42].a * 0.003921569;
          paVar37 = paVar37 + 1;
          paVar22->mNumVertices = paVar22->mNumVertices + 1;
        }
      }
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
    ::~_Rb_tree(&matTexUvMappings._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree(&mat_num_to_mesh_idx._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&per_mat_verts._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&per_mat._M_t);
  }
  return;
}

Assistant:

void BlenderImporter::ConvertMesh(const Scene& /*in*/, const Object* /*obj*/, const Mesh* mesh,
    ConversionData& conv_data, TempArray<std::vector,aiMesh>&  temp
    )
{
    // TODO: Resolve various problems with BMesh triangulation before re-enabling.
    //       See issues #400, #373, #318  #315 and #132.
#if defined(TODO_FIX_BMESH_CONVERSION)
    BlenderBMeshConverter BMeshConverter( mesh );
    if ( BMeshConverter.ContainsBMesh( ) )
    {
        mesh = BMeshConverter.TriangulateBMesh( );
    }
#endif

    typedef std::pair<const int,size_t> MyPair;
    if ((!mesh->totface && !mesh->totloop) || !mesh->totvert) {
        return;
    }

    // some sanity checks
    if (static_cast<size_t> ( mesh->totface ) > mesh->mface.size() ){
        ThrowException("Number of faces is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totvert ) > mesh->mvert.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totloop ) > mesh->mloop.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    // collect per-submesh numbers
    std::map<int,size_t> per_mat;
    std::map<int,size_t> per_mat_verts;
    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];
        per_mat[ mf.mat_nr ]++;
        per_mat_verts[ mf.mat_nr ] += mf.v4?4:3;
    }

    for (int i = 0; i < mesh->totpoly; ++i) {
        const MPoly& mp = mesh->mpoly[i];
        per_mat[ mp.mat_nr ]++;
        per_mat_verts[ mp.mat_nr ] += mp.totloop;
    }

    // ... and allocate the corresponding meshes
    const size_t old = temp->size();
    temp->reserve(temp->size() + per_mat.size());

    std::map<size_t,size_t> mat_num_to_mesh_idx;
    for(MyPair& it : per_mat) {

        mat_num_to_mesh_idx[it.first] = temp->size();
        temp->push_back(new aiMesh());

        aiMesh* out = temp->back();
        out->mVertices = new aiVector3D[per_mat_verts[it.first]];
        out->mNormals  = new aiVector3D[per_mat_verts[it.first]];

        //out->mNumFaces = 0
        //out->mNumVertices = 0
        out->mFaces = new aiFace[it.second]();

        // all sub-meshes created from this mesh are named equally. this allows
        // curious users to recover the original adjacency.
        out->mName = aiString(mesh->id.name+2);
            // skip over the name prefix 'ME'

        // resolve the material reference and add this material to the set of
        // output materials. The (temporary) material index is the index
        // of the material entry within the list of resolved materials.
        if (mesh->mat) {

            if (static_cast<size_t> ( it.first ) >= mesh->mat.size() ) {
                ThrowException("Material index is out of range");
            }

            std::shared_ptr<Material> mat = mesh->mat[it.first];
            const std::deque< std::shared_ptr<Material> >::iterator has = std::find(
                    conv_data.materials_raw.begin(),
                    conv_data.materials_raw.end(),mat
            );

            if (has != conv_data.materials_raw.end()) {
                out->mMaterialIndex = static_cast<unsigned int>( std::distance(conv_data.materials_raw.begin(),has));
            }
            else {
                out->mMaterialIndex = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(mat);
            }
        }
        else out->mMaterialIndex = static_cast<unsigned int>( -1 );
    }

    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.v4?4:3 ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.

        if (mf.v1 >= mesh->totvert) {
            ThrowException("Vertex index v1 out of range");
        }
        const MVert* v = &mesh->mvert[mf.v1];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[0] = out->mNumVertices++;
        ++vo;
        ++vn;

        //  if (f.mNumIndices >= 2) {
        if (mf.v2 >= mesh->totvert) {
            ThrowException("Vertex index v2 out of range");
        }
        v = &mesh->mvert[mf.v2];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[1] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v3 >= mesh->totvert) {
            ThrowException("Vertex index v3 out of range");
        }
        //  if (f.mNumIndices >= 3) {
        v = &mesh->mvert[mf.v3];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[2] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v4 >= mesh->totvert) {
            ThrowException("Vertex index v4 out of range");
        }
        //  if (f.mNumIndices >= 4) {
        if (mf.v4) {
            v = &mesh->mvert[mf.v4];
            vo->x = v->co[0];
            vo->y = v->co[1];
            vo->z = v->co[2];
            vn->x = v->no[0];
            vn->y = v->no[1];
            vn->z = v->no[2];
            f.mIndices[3] = out->mNumVertices++;
            ++vo;
            ++vn;

            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
        else out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;

        //  }
        //  }
        //  }
    }

    for (int i = 0; i < mesh->totpoly; ++i) {

        const MPoly& mf = mesh->mpoly[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.totloop ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.
        for (int j = 0;j < mf.totloop; ++j)
        {
            const MLoop& loop = mesh->mloop[mf.loopstart + j];

            if (loop.v >= mesh->totvert) {
                ThrowException("Vertex index out of range");
            }

            const MVert& v = mesh->mvert[loop.v];

            vo->x = v.co[0];
            vo->y = v.co[1];
            vo->z = v.co[2];
            vn->x = v.no[0];
            vn->y = v.no[1];
            vn->z = v.no[2];
            f.mIndices[j] = out->mNumVertices++;

            ++vo;
            ++vn;

        }
        if (mf.totloop == 3)
        {
            out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
        }
        else
        {
            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
    }

    // TODO should we create the TextureUVMapping map in Convert<Material> to prevent redundant processing?

    // create texture <-> uvname mapping for all materials
    // key is texture number, value is data *
    typedef std::map<uint32_t, const MLoopUV *> TextureUVMapping;
    // key is material number, value is the TextureUVMapping for the material
    typedef std::map<uint32_t, TextureUVMapping> MaterialTextureUVMappings;
    MaterialTextureUVMappings matTexUvMappings;
    const uint32_t maxMat = static_cast<const uint32_t>(mesh->mat.size());
    for (uint32_t m = 0; m < maxMat; ++m) {
        // get material by index
        const std::shared_ptr<Material> pMat = mesh->mat[m];
        TextureUVMapping texuv;
        const uint32_t maxTex = sizeof(pMat->mtex) / sizeof(pMat->mtex[0]);
        for (uint32_t t = 0; t < maxTex; ++t) {
            if (pMat->mtex[t] && pMat->mtex[t]->uvname[0]) {
                // get the CustomData layer for given uvname and correct type
                const ElemBase *pLoop = getCustomDataLayerData(mesh->ldata, CD_MLOOPUV, pMat->mtex[t]->uvname);
                if (pLoop) {
                    texuv.insert(std::make_pair(t, dynamic_cast<const MLoopUV *>(pLoop)));
                }
            }
        }
        if (texuv.size()) {
            matTexUvMappings.insert(std::make_pair(m, texuv));
        }
    }

    // collect texture coordinates, they're stored in a separate per-face buffer
    if (mesh->mtface || mesh->mloopuv) {
        if (mesh->totface > static_cast<int> ( mesh->mtface.size())) {
            ThrowException("Number of UV faces is larger than the corresponding UV face array (#1)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);
            const auto itMatTexUvMapping = matTexUvMappings.find((*it)->mMaterialIndex);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // default behaviour like before
                (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            }
            else {
                // create texture coords for every mapped tex
                for (uint32_t i = 0; i < itMatTexUvMapping->second.size(); ++i) {
                    (*it)->mTextureCoords[i] = new aiVector3D[(*it)->mNumVertices];
                }
            }
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const MTFace* v = &mesh->mtface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            const auto itMatTexUvMapping = matTexUvMappings.find(v.mat_nr);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // old behavior
                aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
                for (unsigned int j = 0; j < f.mNumIndices; ++j, ++vo, ++out->mNumVertices) {
                    const MLoopUV& uv = mesh->mloopuv[v.loopstart + j];
                    vo->x = uv.uv[0];
                    vo->y = uv.uv[1];
                }
            }
            else {
                // create textureCoords for every mapped tex
                for (uint32_t m = 0; m < itMatTexUvMapping->second.size(); ++m) {
                    const MLoopUV *tm = itMatTexUvMapping->second[m];
                    aiVector3D* vo = &out->mTextureCoords[m][out->mNumVertices];
                    uint32_t j = 0;
                    for (; j < f.mNumIndices; ++j, ++vo) {
                        const MLoopUV& uv = tm[v.loopstart + j];
                        vo->x = uv.uv[0];
                        vo->y = uv.uv[1];
                    }
                    // only update written mNumVertices in last loop
                    // TODO why must the numVertices be incremented here?
                    if (m == itMatTexUvMapping->second.size() - 1) {
                        out->mNumVertices += j;
                    }
                }
            }
        }
    }

    // collect texture coordinates, old-style (marked as deprecated in current blender sources)
    if (mesh->tface) {
        if (mesh->totface > static_cast<int> ( mesh->tface.size())) {
            ThrowException("Number of faces is larger than the corresponding UV face array (#2)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const TFace* v = &mesh->tface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }
    }

    // collect vertex colors, stored separately as well
    if (mesh->mcol || mesh->mloopcol) {
        if (mesh->totface > static_cast<int> ( (mesh->mcol.size()/4)) ) {
            ThrowException("Number of faces is larger than the corresponding color face array");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mColors[0] = new aiColor4D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
            for (unsigned int n = 0; n < f.mNumIndices; ++n, ++vo,++out->mNumVertices) {
                const MCol* col = &mesh->mcol[(i<<2)+n];

                vo->r = col->r;
                vo->g = col->g;
                vo->b = col->b;
                vo->a = col->a;
            }
            for (unsigned int n = f.mNumIndices; n < 4; ++n);
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
			const ai_real scaleZeroToOne = 1.f/255.f;
            for (unsigned int j = 0; j < f.mNumIndices; ++j,++vo,++out->mNumVertices) {
                const MLoopCol& col = mesh->mloopcol[v.loopstart + j];
                vo->r = ai_real(col.r) * scaleZeroToOne;
                vo->g = ai_real(col.g) * scaleZeroToOne;
                vo->b = ai_real(col.b) * scaleZeroToOne;
                vo->a = ai_real(col.a) * scaleZeroToOne;
            }

        }

    }

    return;
}